

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall
IlmThread_2_5::anon_unknown_5::NullThreadPoolProvider::addTask(NullThreadPoolProvider *this,Task *t)

{
  Data *in_RSI;
  
  (**(code **)(*(long *)in_RSI + 0x10))();
  Task::group((Task *)in_RSI);
  TaskGroup::Data::removeTask(in_RSI);
  if (in_RSI != (Data *)0x0) {
    (**(code **)(*(long *)in_RSI + 8))();
  }
  return;
}

Assistant:

virtual void addTask (Task *t)
    {
        t->execute ();
        t->group()->_data->removeTask ();
        delete t;
    }